

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O2

ST_ssize_t __thiscall
ST::string::_find_last(string *this,size_t max,char *substr,size_t count,case_sensitivity_t cs)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  size_t size;
  char *haystack;
  char *pcVar4;
  
  haystack = (this->m_buffer).m_chars;
  uVar1 = (this->m_buffer).m_size;
  if (uVar1 < max) {
    max = uVar1;
  }
  pcVar4 = haystack + max;
  pcVar3 = (char *)0x0;
  do {
    pcVar2 = pcVar3;
    size = (long)pcVar4 - (long)haystack;
    if (cs == case_sensitive) {
      pcVar3 = _ST_PRIVATE::find_cs(haystack,size,substr,count);
    }
    else {
      pcVar3 = _ST_PRIVATE::find_ci(haystack,size,substr,count);
    }
  } while ((pcVar3 != (char *)0x0) && (haystack = pcVar3 + 1, pcVar3 < pcVar4));
  return -(ulong)(pcVar2 == (char *)0x0) | (long)pcVar2 - (long)(this->m_buffer).m_chars;
}

Assistant:

ST_NODISCARD
        ST_ssize_t _find_last(size_t max, const char *substr, size_t count,
                              case_sensitivity_t cs = case_sensitive) const noexcept
        {
            const char *endp = c_str() + (max > size() ? size() : max);

            const char *start = c_str();
            const char *found = nullptr;
            for ( ;; ) {
                const char *cp = (cs == case_sensitive)
                        ? _ST_PRIVATE::find_cs(start, endp - start, substr, count)
                        : _ST_PRIVATE::find_ci(start, endp - start, substr, count);
                if (!cp || cp >= endp)
                    break;
                found = cp;
                start = cp + 1;
            }
            return found ? (found - c_str()) : -1;
        }